

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  int iVar1;
  uint uVar2;
  char **__ptr;
  char **__ptr_00;
  char **__ptr_01;
  char **__ptr_02;
  char *pcVar3;
  undefined1 auVar4 [16];
  
  __ptr = (char **)realloc(info->itext_keys,info->itext_num * 8 + 8);
  __ptr_00 = (char **)realloc(info->itext_langtags,info->itext_num * 8 + 8);
  __ptr_01 = (char **)realloc(info->itext_transkeys,info->itext_num * 8 + 8);
  __ptr_02 = (char **)realloc(info->itext_strings,info->itext_num * 8 + 8);
  auVar4._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
  auVar4._4_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)((ulong)__ptr_01 >> 0x20) == 0 && (int)__ptr_01 == 0);
  auVar4._12_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
  iVar1 = movmskps((int)__ptr_02,auVar4);
  if (iVar1 == 0) {
    info->itext_num = info->itext_num + 1;
    info->itext_keys = __ptr;
    info->itext_langtags = __ptr_00;
    info->itext_transkeys = __ptr_01;
    info->itext_strings = __ptr_02;
    pcVar3 = alloc_string(key);
    info->itext_keys[info->itext_num - 1] = pcVar3;
    pcVar3 = alloc_string(langtag);
    info->itext_langtags[info->itext_num - 1] = pcVar3;
    pcVar3 = alloc_string(transkey);
    info->itext_transkeys[info->itext_num - 1] = pcVar3;
    pcVar3 = alloc_string(str);
    info->itext_strings[info->itext_num - 1] = pcVar3;
    uVar2 = 0;
  }
  else {
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    uVar2 = 0x53;
  }
  return uVar2;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str) {
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings) {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  info->itext_keys[info->itext_num - 1] = alloc_string(key);
  info->itext_langtags[info->itext_num - 1] = alloc_string(langtag);
  info->itext_transkeys[info->itext_num - 1] = alloc_string(transkey);
  info->itext_strings[info->itext_num - 1] = alloc_string(str);

  return 0;
}